

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void FBehavior::StaticMarkLevelVarStrings(void)

{
  ulong uVar1;
  DLevelScript *this;
  
  if (StaticModules.Count != 0) {
    uVar1 = 0;
    do {
      MarkMapVarStrings(StaticModules.Array[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < StaticModules.Count);
  }
  if (DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) {
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) == 0) {
      for (this = *(DLevelScript **)((long)DACSThinker::ActiveThinker.field_0 + 0x58);
          this != (DLevelScript *)0x0; this = this->next) {
        DLevelScript::MarkLocalVarStrings(this);
      }
    }
    else {
      DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
    }
  }
  return;
}

Assistant:

void FBehavior::StaticMarkLevelVarStrings()
{
	// Mark map variables.
	for (DWORD modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		StaticModules[modnum]->MarkMapVarStrings();
	}
	// Mark running scripts' local variables.
	if (DACSThinker::ActiveThinker != NULL)
	{
		for (DLevelScript *script = DACSThinker::ActiveThinker->Scripts; script != NULL; script = script->GetNext())
		{
			script->MarkLocalVarStrings();
		}
	}
}